

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  size_type sVar2;
  float *pfVar3;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar4;
  float fVar5;
  int k_5;
  float sum_6;
  float *kptr_4;
  float *ptr_4;
  int j_9;
  float *outptr_6;
  int i_7;
  int k_4;
  float sum_5;
  float *vptr;
  float *qkptr;
  int j_8;
  float *outptr_5;
  int i_6;
  Mat xvm;
  Mat xqkm;
  int j_7;
  int j_6;
  float sum_4;
  int j_5;
  float max;
  float *ptr_3;
  int i_5;
  Mat outm_5;
  int j_4;
  float *outptr_4;
  float *mptr;
  int i_4;
  Mat outm_4;
  Mat *maskm;
  int k_3;
  float sum_3;
  float *kptr_3;
  float *qptr;
  int j_3;
  float *outptr_3;
  int i_3;
  Mat outm_3;
  Mat xkm;
  Mat xqm;
  float *outptr_2;
  int k_2;
  float sum_2;
  float *kptr_2;
  float *ptr_2;
  int j_2;
  int i_2;
  Mat outm_2;
  int k_1;
  float sum_1;
  float *kptr_1;
  float *ptr_1;
  int j_1;
  float *outptr_1;
  int i_1;
  Mat outm_1;
  int k;
  float sum;
  float *kptr;
  float *ptr;
  int j;
  float *outptr;
  int i;
  Mat outm;
  int q;
  Mat xqkv;
  Mat xqk;
  Mat xv;
  Mat xk;
  Mat xq;
  Mat *top_blob;
  int qdim;
  int embed_dim_per_head;
  int dst_seqlen;
  int src_seqlen;
  Mat *attn_mask_blob;
  Mat *v_blob;
  Mat *k_blob;
  Mat *q_blob;
  Mat *m_12;
  Mat *m_11;
  Mat *m_10;
  Mat *m_9;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_6;
  Allocator *in_stack_ffffffffffffe6d8;
  void **ppvVar6;
  Allocator *in_stack_ffffffffffffe6e0;
  size_t in_stack_ffffffffffffe6e8;
  undefined4 in_stack_ffffffffffffe6f0;
  int in_stack_ffffffffffffe6f4;
  undefined8 in_stack_ffffffffffffe6f8;
  Mat *in_stack_ffffffffffffe700;
  bool local_1631;
  bool local_1611;
  bool local_15f1;
  bool local_15d1;
  bool local_15b1;
  const_reference local_1570;
  const_reference local_1568;
  const_reference local_1560;
  int local_1550;
  float local_154c;
  float *local_1548;
  undefined8 local_1540;
  undefined8 local_1538;
  undefined8 local_1530;
  undefined4 local_1528;
  long *local_1520;
  undefined4 local_1518;
  undefined4 local_1514;
  undefined4 local_1510;
  undefined4 local_150c;
  undefined4 local_1508;
  undefined8 local_1500;
  float *local_14f8;
  int local_14ec;
  void *local_14e8;
  int local_14dc;
  int local_14d8;
  float local_14d4;
  float *local_14d0;
  float *local_14c8;
  int local_14bc;
  undefined8 local_14b8;
  undefined8 local_14b0;
  undefined8 local_14a8;
  undefined4 local_14a0;
  long *local_1498;
  undefined4 local_1490;
  undefined4 local_148c;
  undefined4 local_1488;
  undefined4 local_1484;
  undefined4 local_1480;
  undefined8 local_1478;
  long local_1470;
  int local_1464;
  undefined8 local_1460;
  undefined8 local_1458;
  undefined8 local_1450;
  undefined4 local_1448;
  long *local_1440;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined4 local_142c;
  undefined4 local_1428;
  undefined8 local_1420;
  undefined8 local_1418;
  undefined8 local_1410;
  undefined8 local_1408;
  undefined4 local_1400;
  long *local_13f8;
  undefined4 local_13f0;
  undefined4 local_13ec;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined4 local_13e0;
  undefined8 local_13d8;
  int local_13cc;
  int local_13c8;
  float local_13c4;
  int local_13c0;
  float local_13bc;
  void *local_13b8;
  int local_13ac;
  void *local_13a8;
  int *local_13a0;
  ulong local_1398;
  undefined4 local_1390;
  long *local_1388;
  int local_1380;
  int local_137c;
  int local_1378;
  undefined4 local_1374;
  undefined4 local_1370;
  ulong local_1368;
  int local_135c;
  long local_1358;
  void *local_1350;
  int local_1344;
  undefined8 local_1340;
  undefined8 local_1338;
  undefined8 local_1330;
  undefined4 local_1328;
  long *local_1320;
  undefined4 local_1318;
  undefined4 local_1314;
  undefined4 local_1310;
  undefined4 local_130c;
  undefined4 local_1308;
  undefined8 local_1300;
  void *local_12f8;
  int *local_12f0;
  void *local_12e8;
  undefined4 local_12e0;
  long *local_12d8;
  int local_12d0;
  int local_12cc;
  int local_12c8;
  undefined4 local_12c4;
  undefined4 local_12c0;
  void *local_12b8;
  void **local_12b0;
  int local_12a8;
  float local_12a4;
  float *local_12a0;
  float *local_1298;
  int local_128c;
  long local_1288;
  int local_127c;
  undefined8 local_1278;
  undefined8 local_1270;
  undefined8 local_1268;
  undefined4 local_1260;
  long *local_1258;
  undefined4 local_1250;
  undefined4 local_124c;
  undefined4 local_1248;
  undefined4 local_1244;
  undefined4 local_1240;
  undefined8 local_1238;
  undefined8 local_1230;
  undefined8 local_1228;
  undefined8 local_1220;
  undefined4 local_1218;
  long *local_1210;
  undefined4 local_1208;
  undefined4 local_1204;
  undefined4 local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  undefined8 local_11f0;
  undefined8 local_11e8;
  undefined8 local_11e0;
  undefined8 local_11d8;
  undefined4 local_11d0;
  long *local_11c8;
  undefined4 local_11c0;
  undefined4 local_11bc;
  undefined4 local_11b8;
  undefined4 local_11b4;
  undefined4 local_11b0;
  undefined8 local_11a8;
  long local_11a0;
  int local_1198;
  float local_1194;
  float *local_1190;
  float *local_1188;
  int local_1180;
  int local_117c;
  undefined8 local_1178;
  undefined8 local_1170;
  undefined8 local_1168;
  undefined4 local_1160;
  long *local_1158;
  undefined4 local_1150;
  undefined4 local_114c;
  undefined4 local_1148;
  undefined4 local_1144;
  undefined4 local_1140;
  undefined8 local_1138;
  int local_1130;
  float local_112c;
  float *local_1128;
  float *local_1120;
  int local_1114;
  long local_1110;
  int local_1104;
  undefined8 local_1100;
  undefined8 local_10f8;
  undefined8 local_10f0;
  undefined4 local_10e8;
  long *local_10e0;
  undefined4 local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  undefined4 local_10cc;
  undefined4 local_10c8;
  undefined8 local_10c0;
  int local_10b8;
  float local_10b4;
  float *local_10b0;
  float *local_10a8;
  int local_109c;
  long local_1098;
  int local_108c;
  undefined8 local_1088;
  undefined8 local_1080;
  undefined8 local_1078;
  undefined4 local_1070;
  long *local_1068;
  undefined4 local_1060;
  undefined4 local_105c;
  undefined4 local_1058;
  undefined4 local_1054;
  undefined4 local_1050;
  undefined8 local_1048;
  int local_103c;
  void *local_1038;
  int *local_1030;
  long local_1028;
  undefined4 local_1020;
  long *local_1018;
  undefined4 local_1010;
  int local_100c;
  undefined4 local_1008;
  undefined4 local_1004;
  int local_1000;
  long local_ff8;
  void *local_ff0;
  int *local_fe8;
  ulong local_fe0;
  undefined4 local_fd8;
  long *local_fd0;
  int local_fc8;
  int local_fc4;
  int local_fc0;
  undefined4 local_fbc;
  int local_fb8;
  long local_fb0;
  void *local_fa8;
  int *local_fa0;
  long local_f98;
  undefined4 local_f90;
  long *local_f88;
  undefined4 local_f80;
  int local_f7c;
  undefined4 local_f78;
  undefined4 local_f74;
  int local_f70;
  long local_f68;
  void *local_f60;
  int *local_f58;
  long local_f50;
  undefined4 local_f48;
  long *local_f40;
  undefined4 local_f38;
  int local_f34;
  undefined4 local_f30;
  undefined4 local_f2c;
  int local_f28;
  long local_f20;
  void *local_f18;
  int *local_f10;
  long local_f08;
  undefined4 local_f00;
  long *local_ef8;
  undefined4 local_ef0;
  int local_eec;
  undefined4 local_ee8;
  undefined4 local_ee4;
  int local_ee0;
  long local_ed8;
  undefined4 local_ed0;
  reference local_ec0;
  int local_eb8;
  int local_eb4;
  int local_eb0;
  int local_eac;
  void *local_ea8;
  int *local_ea0;
  size_t local_e98;
  int local_e90;
  Allocator *local_e88;
  int local_e80;
  int local_e7c;
  int local_e78;
  int local_e74;
  int local_e70;
  size_t local_e68;
  void **local_e60;
  const_reference local_e58;
  const_reference local_e50;
  const_reference local_e48;
  long local_e40;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e38;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e30;
  int local_e1c;
  void **local_e18;
  undefined8 *local_e10;
  undefined8 *local_e00;
  undefined8 *local_df0;
  undefined8 *local_de0;
  undefined8 *local_dd0;
  undefined8 *local_dc0;
  undefined8 *local_db0;
  void **local_da0;
  void **local_d90;
  undefined8 *local_d80;
  undefined8 *local_d70;
  undefined8 *local_d60;
  undefined8 *local_d50;
  void **local_d40;
  void **local_d30;
  void **local_d20;
  void **local_d10;
  void **local_d00;
  void **local_cf0;
  void **local_ce0;
  void **local_cd8;
  void **local_cd0;
  void **local_cc8;
  void **local_cc0;
  reference local_cb8;
  const_reference local_cb0;
  void **local_ca8;
  void **local_ca0;
  void **local_c98;
  undefined8 local_c90;
  undefined8 local_c88;
  undefined4 local_c7c;
  int local_c78;
  int local_c74;
  void **local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined4 local_c54;
  int local_c50;
  int local_c4c;
  void **local_c48;
  undefined8 local_c40;
  undefined8 local_c38;
  undefined4 local_c2c;
  int local_c28;
  int local_c24;
  void **local_c20;
  undefined8 local_c18;
  undefined8 local_c10;
  undefined4 local_c04;
  int local_c00;
  int local_bfc;
  void **local_bf8;
  undefined8 local_bf0;
  undefined8 local_be8;
  int local_bdc;
  undefined4 local_bd8;
  int local_bd4;
  void **local_bd0;
  undefined1 local_bc5;
  int local_bc4;
  void **local_bc0;
  undefined8 *local_bb8;
  undefined1 local_ba5;
  int local_ba4;
  void **local_ba0;
  undefined8 *local_b98;
  undefined1 local_b85;
  int local_b84;
  void **local_b80;
  undefined8 *local_b78;
  undefined1 local_b65;
  int local_b64;
  void **local_b60;
  undefined8 *local_b58;
  undefined1 local_b45;
  int local_b44;
  void **local_b40;
  void **local_b38;
  undefined1 local_b25;
  int local_b24;
  void **local_b20;
  undefined8 *local_b18;
  undefined1 local_b05;
  int local_b04;
  void **local_b00;
  undefined8 *local_af8;
  undefined1 local_ae5;
  int local_ae4;
  void **local_ae0;
  undefined8 *local_ad8;
  undefined1 local_ac5;
  int local_ac4;
  void **local_ac0;
  undefined8 *local_ab8;
  undefined1 local_aa5;
  int local_aa4;
  void **local_aa0;
  undefined8 *local_a98;
  undefined1 local_a85;
  int local_a84;
  void **local_a80;
  undefined8 *local_a78;
  undefined1 local_a65;
  int local_a64;
  void **local_a60;
  undefined8 *local_a58;
  int local_a44;
  reference local_a40;
  int local_a34;
  undefined8 *local_a30;
  int local_a24;
  void **local_a20;
  int local_a14;
  undefined8 *local_a10;
  int local_a04;
  undefined8 *local_a00;
  int local_9f4;
  undefined8 *local_9f0;
  int local_9e4;
  undefined8 *local_9e0;
  int local_9d4;
  undefined8 *local_9d0;
  int local_9c4;
  undefined8 *local_9c0;
  int local_9b4;
  undefined8 *local_9b0;
  int local_9a4;
  void **local_9a0;
  int local_994;
  undefined8 *local_990;
  int local_984;
  undefined8 *local_980;
  int local_974;
  const_reference local_970;
  int local_964;
  const_reference local_960;
  int local_954;
  const_reference local_950;
  long *local_948;
  long *local_940;
  long *local_938;
  long *local_930;
  long local_928;
  long *local_920;
  long local_918;
  long *local_910;
  long local_908;
  long *local_900;
  long local_8f8;
  long *local_8f0;
  undefined1 local_8e5;
  int local_8e4;
  void **local_8e0;
  void **local_8d8;
  undefined8 *local_8c8;
  int local_7e0;
  undefined4 local_7dc;
  void **local_7d8;
  int local_7c0;
  undefined4 local_7bc;
  void **local_7b8;
  int local_7a0;
  undefined4 local_79c;
  void **local_798;
  int local_780;
  undefined4 local_77c;
  Option *in_stack_fffffffffffff888;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff890;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a4;
  
  if (*(int *)(in_RDI + 0xec) == 0) {
    local_e40 = in_RCX;
    local_e38 = in_RDX;
    local_e30 = in_RSI;
    local_e48 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
    sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_e30);
    if ((sVar2 == 1) ||
       ((sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_e30), sVar2 == 2 &&
        (*(int *)(in_RDI + 0xe4) != 0)))) {
      local_1560 = local_e48;
    }
    else {
      local_1560 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_e30,1);
    }
    local_e50 = local_1560;
    sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_e30);
    if ((sVar2 == 1) ||
       ((sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_e30), sVar2 == 2 &&
        (*(int *)(in_RDI + 0xe4) != 0)))) {
      local_1568 = local_e48;
    }
    else {
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_e30);
      if ((sVar2 == 2) ||
         ((sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_e30), sVar2 == 3
          && (*(int *)(in_RDI + 0xe4) != 0)))) {
        local_1570 = local_e50;
      }
      else {
        local_1570 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_e30,2);
      }
      local_1568 = local_1570;
    }
    local_e58 = local_1568;
    if (*(int *)(in_RDI + 0xe4) == 0) {
      local_e18 = &local_ea8;
      local_ea8 = (void *)0x0;
      local_ea0 = (int *)0x0;
      local_e98 = 0;
      local_e90 = 0;
      local_e88 = (Allocator *)0x0;
      local_e80 = 0;
      local_e7c = 0;
      local_e78 = 0;
      local_e74 = 0;
      local_e70 = 0;
      local_e68 = 0;
    }
    else {
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_e30);
      local_cb0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_e30,sVar2 - 1);
      local_ca8 = &local_ea8;
      local_ea8 = local_cb0->data;
      local_ea0 = local_cb0->refcount;
      local_e98 = local_cb0->elemsize;
      local_e90 = local_cb0->elempack;
      local_e88 = local_cb0->allocator;
      local_e80 = local_cb0->dims;
      local_e7c = local_cb0->w;
      local_e78 = local_cb0->h;
      local_e74 = local_cb0->d;
      local_e70 = local_cb0->c;
      local_e68 = local_cb0->cstep;
      if (local_ea0 != (int *)0x0) {
        LOCK();
        *local_ea0 = *local_ea0 + 1;
        UNLOCK();
      }
    }
    local_e60 = &local_ea8;
    local_eac = local_e48->h;
    local_eb0 = local_e50->h;
    local_eb4 = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0xd4);
    local_eb8 = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
    local_ec0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_e38,0);
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
                (int)(in_stack_ffffffffffffe6e8 >> 0x20),(int)in_stack_ffffffffffffe6e8,
                (size_t)in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8);
    local_cb8 = local_ec0;
    bVar4 = true;
    if (local_ec0->data != (void *)0x0) {
      bVar4 = local_ec0->cstep * (long)local_ec0->c == 0;
    }
    if (bVar4) {
      local_e1c = -100;
      local_ed0 = 1;
    }
    else {
      local_c7c = *(undefined4 *)(in_RDI + 0xd4);
      local_c90 = *(undefined8 *)(local_e40 + 0x10);
      local_c70 = &local_f18;
      local_c74 = local_eb4;
      local_c78 = local_eac;
      local_c88 = 4;
      local_f18 = (void *)0x0;
      local_f10 = (int *)0x0;
      local_f08 = 0;
      local_f00 = 0;
      local_ef8 = (long *)0x0;
      local_ef0 = 0;
      local_eec = 0;
      local_ee8 = 0;
      local_ee4 = 0;
      local_ee0 = 0;
      local_ed8 = 0;
      Mat::create(in_stack_ffffffffffffe700,(int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                  (int)in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6e8
                  ,in_stack_ffffffffffffe6e0);
      local_cc0 = &local_f18;
      local_15b1 = local_f18 == (void *)0x0 || local_ed8 * local_ee0 == 0;
      if (local_15b1) {
        local_e1c = -100;
        local_ed0 = 1;
      }
      else {
        local_c54 = *(undefined4 *)(in_RDI + 0xd4);
        local_c68 = *(undefined8 *)(local_e40 + 0x10);
        local_c48 = &local_f60;
        local_c4c = local_eb4;
        local_c50 = local_eb0;
        local_c60 = 4;
        local_f60 = (void *)0x0;
        local_f58 = (int *)0x0;
        local_f50 = 0;
        local_f48 = 0;
        local_f40 = (long *)0x0;
        local_f38 = 0;
        local_f34 = 0;
        local_f30 = 0;
        local_f2c = 0;
        local_f28 = 0;
        local_f20 = 0;
        Mat::create(in_stack_ffffffffffffe700,(int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                    (int)in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f4,
                    in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0);
        local_cc8 = &local_f60;
        local_15d1 = local_f60 == (void *)0x0 || local_f20 * local_f28 == 0;
        if (local_15d1) {
          local_e1c = -100;
          local_ed0 = 1;
        }
        else {
          local_c2c = *(undefined4 *)(in_RDI + 0xd4);
          local_c40 = *(undefined8 *)(local_e40 + 0x10);
          local_c20 = &local_fa8;
          local_c24 = local_eb0;
          local_c28 = local_eb4;
          local_c38 = 4;
          local_fa8 = (void *)0x0;
          local_fa0 = (int *)0x0;
          local_f98 = 0;
          local_f90 = 0;
          local_f88 = (long *)0x0;
          local_f80 = 0;
          local_f7c = 0;
          local_f78 = 0;
          local_f74 = 0;
          local_f70 = 0;
          local_f68 = 0;
          Mat::create(in_stack_ffffffffffffe700,(int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                      (int)in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f4,
                      in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0);
          local_cd0 = &local_fa8;
          local_15f1 = local_fa8 == (void *)0x0 || local_f68 * local_f70 == 0;
          if (local_15f1) {
            local_e1c = -100;
            local_ed0 = 1;
          }
          else {
            local_c04 = *(undefined4 *)(in_RDI + 0xd4);
            local_c18 = *(undefined8 *)(local_e40 + 0x10);
            local_bf8 = &local_ff0;
            local_bfc = local_eb0;
            local_c00 = local_eac;
            local_c10 = 4;
            local_ff0 = (void *)0x0;
            local_fe8 = (int *)0x0;
            local_fe0 = 0;
            local_fd8 = 0;
            local_fd0 = (long *)0x0;
            local_fc8 = 0;
            local_fc4 = 0;
            local_fc0 = 0;
            local_fbc = 0;
            local_fb8 = 0;
            local_fb0 = 0;
            Mat::create(in_stack_ffffffffffffe700,(int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                        (int)in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f4,
                        in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0);
            local_cd8 = &local_ff0;
            local_1611 = local_ff0 == (void *)0x0 || local_fb0 * local_fb8 == 0;
            if (local_1611) {
              local_e1c = -100;
              local_ed0 = 1;
            }
            else {
              local_bd8 = *(undefined4 *)(in_RDI + 0xd4);
              local_bf0 = *(undefined8 *)(local_e40 + 0x10);
              local_bd0 = &local_1038;
              local_bd4 = local_eb4;
              local_bdc = local_eac;
              local_be8 = 4;
              local_1038 = (void *)0x0;
              local_1030 = (int *)0x0;
              local_1028 = 0;
              local_1020 = 0;
              local_1018 = (long *)0x0;
              local_1010 = 0;
              local_100c = 0;
              local_1008 = 0;
              local_1004 = 0;
              local_1000 = 0;
              local_ff8 = 0;
              Mat::create(in_stack_ffffffffffffe700,(int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                          (int)in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f4,
                          in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0);
              local_ce0 = &local_1038;
              local_1631 = local_1038 == (void *)0x0 || local_ff8 * local_1000 == 0;
              if (local_1631) {
                local_e1c = -100;
              }
              else {
                for (local_103c = 0; local_103c < *(int *)(in_RDI + 0xd4);
                    local_103c = local_103c + 1) {
                  local_a58 = &local_1088;
                  local_a60 = &local_f18;
                  local_1068 = local_ef8;
                  for (local_108c = 0; local_108c < local_eac; local_108c = local_108c + 1) {
                    local_9d4 = local_108c;
                    local_9d0 = &local_1088;
                    local_1098 = (long)local_f18 +
                                 (long)local_eec * (long)local_108c * local_f08 +
                                 local_ed8 * local_103c * local_f08;
                    for (local_109c = 0; local_109c < local_eb4; local_109c = local_109c + 1) {
                      local_950 = local_e48;
                      local_954 = local_108c;
                      local_930 = (long *)(in_RDI + 0xf0);
                      local_8f0 = (long *)(in_RDI + 0x138);
                      local_8f8 = (long)(local_103c * local_eb4 + local_109c);
                      local_10b4 = *(float *)(*local_8f0 + local_8f8 * 4);
                      local_10b0 = (float *)(*local_930 +
                                            (long)(local_eb8 * (local_103c * local_eb4 + local_109c)
                                                  ) * 4);
                      local_10a8 = (float *)((long)local_e48->data +
                                            (long)local_e48->w * (long)local_108c *
                                            local_e48->elemsize);
                      for (local_10b8 = 0; local_10b8 < local_eb8; local_10b8 = local_10b8 + 1) {
                        local_10b4 = *local_10a8 * *local_10b0 + local_10b4;
                        local_10b0 = local_10b0 + 1;
                        local_10a8 = local_10a8 + 1;
                      }
                      *(float *)(local_1098 + (long)local_109c * 4) =
                           local_10b4 * *(float *)(in_RDI + 0xe8);
                    }
                  }
                  local_e10 = &local_1088;
                  local_1088 = 0;
                  local_1078 = 0;
                  local_1070 = 0;
                  local_105c = 0;
                  local_1058 = 0;
                  local_1054 = 0;
                  local_1050 = 0;
                  local_1080 = 0;
                  local_a78 = &local_1100;
                  local_a80 = &local_f60;
                  local_10e0 = local_f40;
                  for (local_1104 = 0; local_1104 < local_eb0; local_1104 = local_1104 + 1) {
                    local_9e4 = local_1104;
                    local_9e0 = &local_1100;
                    local_1110 = (long)local_f60 +
                                 (long)local_f34 * (long)local_1104 * local_f50 +
                                 local_f20 * local_103c * local_f50;
                    for (local_1114 = 0; local_1114 < local_eb4; local_1114 = local_1114 + 1) {
                      local_960 = local_e50;
                      local_964 = local_1104;
                      local_938 = (long *)(in_RDI + 0x180);
                      local_900 = (long *)(in_RDI + 0x1c8);
                      local_908 = (long)(local_103c * local_eb4 + local_1114);
                      local_112c = *(float *)(*local_900 + local_908 * 4);
                      local_1128 = (float *)(*local_938 +
                                            (long)(*(int *)(in_RDI + 0xdc) *
                                                  (local_103c * local_eb4 + local_1114)) * 4);
                      local_1120 = (float *)((long)local_e50->data +
                                            (long)local_e50->w * (long)local_1104 *
                                            local_e50->elemsize);
                      for (local_1130 = 0; local_1130 < *(int *)(in_RDI + 0xdc);
                          local_1130 = local_1130 + 1) {
                        local_112c = *local_1120 * *local_1128 + local_112c;
                        local_1128 = local_1128 + 1;
                        local_1120 = local_1120 + 1;
                      }
                      *(float *)(local_1110 + (long)local_1114 * 4) = local_112c;
                    }
                  }
                  local_e00 = &local_1100;
                  local_1100 = 0;
                  local_10f0 = 0;
                  local_10e8 = 0;
                  local_10d4 = 0;
                  local_10d0 = 0;
                  local_10cc = 0;
                  local_10c8 = 0;
                  local_10f8 = 0;
                  local_a98 = &local_1178;
                  local_aa0 = &local_fa8;
                  local_1158 = local_f88;
                  for (local_117c = 0; local_117c < local_eb4; local_117c = local_117c + 1) {
                    for (local_1180 = 0; local_1180 < local_eb0; local_1180 = local_1180 + 1) {
                      local_970 = local_e58;
                      local_974 = local_1180;
                      local_940 = (long *)(in_RDI + 0x210);
                      local_910 = (long *)(in_RDI + 600);
                      local_918 = (long)(local_103c * local_eb4 + local_117c);
                      local_1194 = *(float *)(*local_910 + local_918 * 4);
                      local_1190 = (float *)(*local_940 +
                                            (long)(*(int *)(in_RDI + 0xe0) *
                                                  (local_103c * local_eb4 + local_117c)) * 4);
                      local_1188 = (float *)((long)local_e58->data +
                                            (long)local_e58->w * (long)local_1180 *
                                            local_e58->elemsize);
                      for (local_1198 = 0; local_1198 < *(int *)(in_RDI + 0xe0);
                          local_1198 = local_1198 + 1) {
                        local_1194 = *local_1188 * *local_1190 + local_1194;
                        local_1190 = local_1190 + 1;
                        local_1188 = local_1188 + 1;
                      }
                      local_9f4 = local_117c;
                      local_9f0 = &local_1178;
                      local_11a0 = (long)local_fa8 +
                                   (long)local_f7c * (long)local_117c * local_f98 +
                                   local_f68 * local_103c * local_f98;
                      *(float *)(local_11a0 + (long)local_1180 * 4) = local_1194;
                    }
                  }
                  local_df0 = &local_1178;
                  local_1178 = 0;
                  local_1168 = 0;
                  local_1160 = 0;
                  local_114c = 0;
                  local_1148 = 0;
                  local_1144 = 0;
                  local_1140 = 0;
                  local_1170 = 0;
                  local_ab8 = &local_11e8;
                  local_ac0 = &local_f18;
                  local_11c8 = local_ef8;
                  local_ad8 = &local_1230;
                  local_ae0 = &local_f60;
                  local_1210 = local_f40;
                  local_af8 = &local_1278;
                  local_b00 = &local_ff0;
                  local_1258 = local_fd0;
                  for (local_127c = 0; local_127c < local_eac; local_127c = local_127c + 1) {
                    local_a04 = local_127c;
                    local_a00 = &local_1278;
                    local_1288 = (long)local_ff0 +
                                 (long)local_fc4 * (long)local_127c * local_fe0 +
                                 local_fb0 * local_103c * local_fe0;
                    for (local_128c = 0; local_128c < local_eb0; local_128c = local_128c + 1) {
                      local_984 = local_127c;
                      local_980 = &local_11e8;
                      local_994 = local_128c;
                      local_990 = &local_1230;
                      local_12a4 = 0.0;
                      local_12a0 = (float *)((long)local_f60 +
                                            (long)local_f34 * (long)local_128c * local_f50 +
                                            local_f20 * local_103c * local_f50);
                      local_1298 = (float *)((long)local_f18 +
                                            (long)local_eec * (long)local_127c * local_f08 +
                                            local_ed8 * local_103c * local_f08);
                      for (local_12a8 = 0; local_12a8 < local_eb4; local_12a8 = local_12a8 + 1) {
                        local_12a4 = *local_1298 * *local_12a0 + local_12a4;
                        local_12a0 = local_12a0 + 1;
                        local_1298 = local_1298 + 1;
                      }
                      *(float *)(local_1288 + (long)local_128c * 4) = local_12a4;
                    }
                  }
                  local_de0 = &local_1278;
                  local_1278 = 0;
                  local_1268 = 0;
                  local_1260 = 0;
                  local_124c = 0;
                  local_1248 = 0;
                  local_1244 = 0;
                  local_1240 = 0;
                  local_1270 = 0;
                  local_dd0 = &local_1230;
                  local_1230 = 0;
                  local_1220 = 0;
                  local_1218 = 0;
                  local_1204 = 0;
                  local_1200 = 0;
                  local_11fc = 0;
                  local_11f8 = 0;
                  local_1228 = 0;
                  local_dc0 = &local_11e8;
                  local_1050 = 0;
                  local_1054 = 0;
                  local_1058 = 0;
                  local_105c = 0;
                  local_1070 = 0;
                  local_1078 = 0;
                  local_1080 = 0;
                  local_1088 = 0;
                  local_10c8 = 0;
                  local_10cc = 0;
                  local_10d0 = 0;
                  local_10d4 = 0;
                  local_10e8 = 0;
                  local_10f0 = 0;
                  local_10f8 = 0;
                  local_1100 = 0;
                  local_1140 = 0;
                  local_1144 = 0;
                  local_1148 = 0;
                  local_114c = 0;
                  local_1160 = 0;
                  local_1168 = 0;
                  local_1170 = 0;
                  local_1178 = 0;
                  local_11f8 = 0;
                  local_11fc = 0;
                  local_1200 = 0;
                  local_1204 = 0;
                  local_1218 = 0;
                  local_1220 = 0;
                  local_1228 = 0;
                  local_1230 = 0;
                  local_1240 = 0;
                  local_1244 = 0;
                  local_1248 = 0;
                  local_124c = 0;
                  local_1260 = 0;
                  local_1268 = 0;
                  local_1270 = 0;
                  local_1278 = 0;
                  local_a64 = local_103c;
                  local_a65 = 1;
                  local_a84 = local_103c;
                  local_a85 = 1;
                  local_aa4 = local_103c;
                  local_aa5 = 1;
                  local_ac4 = local_103c;
                  local_ac5 = 1;
                  local_ae4 = local_103c;
                  local_ae5 = 1;
                  local_b04 = local_103c;
                  local_b05 = 1;
                  local_1048 = 0;
                  local_1060 = 0;
                  local_10c0 = 0;
                  local_10d8 = 0;
                  local_1138 = 0;
                  local_1150 = 0;
                  local_11f0 = 0;
                  local_1208 = 0;
                  local_1238 = 0;
                  local_1250 = 0;
                  local_11e8 = 0;
                  local_11d8 = 0;
                  local_11d0 = 0;
                  local_11c0 = 0;
                  local_11bc = 0;
                  local_11b8 = 0;
                  local_11b4 = 0;
                  local_11b0 = 0;
                  local_11a8 = 0;
                  local_11e0 = 0;
                  if (*(int *)(in_RDI + 0xe4) != 0) {
                    if (*(int *)(local_e60 + 5) == 3) {
                      local_8d8 = &local_12f8;
                      local_12e8 = local_e60[2];
                      local_12f8 = (void *)((long)*local_e60 +
                                           (long)local_e60[8] * (long)local_103c *
                                           (long)local_e60[2]);
                      local_12f0 = (int *)0x0;
                      local_12e0 = *(undefined4 *)(local_e60 + 3);
                      local_12d8 = (long *)local_e60[4];
                      local_12cc = *(int *)((long)local_e60 + 0x2c);
                      local_12c8 = *(int *)(local_e60 + 6);
                      local_12c4 = 1;
                      local_12c0 = *(undefined4 *)((long)local_e60 + 0x34);
                      local_12b8 = (void *)(((long)*(int *)((long)local_e60 + 0x2c) *
                                             (long)*(int *)(local_e60 + 6) * (long)local_12e8 + 0xfU
                                            & 0xfffffffffffffff0) / (ulong)local_12e8);
                      local_12d0 = *(int *)(local_e60 + 5) + -1;
                      if (*(int *)(local_e60 + 5) == 4) {
                        local_12b8 = (void *)((long)*(int *)((long)local_e60 + 0x2c) *
                                             (long)*(int *)(local_e60 + 6));
                      }
                      local_8e0 = local_e60;
                      local_8e4 = local_103c;
                      local_8e5 = 1;
                    }
                    else {
                      local_c98 = &local_12f8;
                      local_ca0 = local_e60;
                      local_12f8 = *local_e60;
                      local_12f0 = (int *)local_e60[1];
                      local_12e8 = local_e60[2];
                      local_12e0 = *(undefined4 *)(local_e60 + 3);
                      local_12d8 = (long *)local_e60[4];
                      local_12d0 = *(int *)(local_e60 + 5);
                      local_12cc = *(int *)((long)local_e60 + 0x2c);
                      local_12c8 = *(int *)(local_e60 + 6);
                      local_12c4 = *(undefined4 *)((long)local_e60 + 0x34);
                      local_12c0 = *(undefined4 *)(local_e60 + 7);
                      local_12b8 = local_e60[8];
                      if (local_12f0 != (int *)0x0) {
                        LOCK();
                        *local_12f0 = *local_12f0 + 1;
                        UNLOCK();
                      }
                    }
                    local_12b0 = &local_12f8;
                    local_b18 = &local_1340;
                    local_b20 = &local_ff0;
                    for (local_1344 = 0; local_1344 < local_eac; local_1344 = local_1344 + 1) {
                      local_9a4 = local_1344;
                      local_1350 = (void *)((long)local_12f8 +
                                           (long)local_12cc * (long)local_1344 * (long)local_12e8);
                      local_a14 = local_1344;
                      local_a10 = &local_1340;
                      local_1358 = (long)local_ff0 +
                                   (long)local_fc4 * (long)local_1344 * local_fe0 +
                                   local_fb0 * local_103c * local_fe0;
                      for (local_135c = 0; local_135c < local_eb0; local_135c = local_135c + 1) {
                        *(float *)(local_1358 + (long)local_135c * 4) =
                             *(float *)((long)local_1350 + (long)local_135c * 4) +
                             *(float *)(local_1358 + (long)local_135c * 4);
                      }
                      local_9a0 = local_12b0;
                    }
                    local_db0 = &local_1340;
                    local_11b0 = 0;
                    local_11b4 = 0;
                    local_11b8 = 0;
                    local_11bc = 0;
                    local_11d0 = 0;
                    local_11d8 = 0;
                    local_11e0 = 0;
                    local_11e8 = 0;
                    local_1320 = local_fd0;
                    local_b24 = local_103c;
                    local_b25 = 1;
                    local_11a8 = 0;
                    local_11c0 = 0;
                    local_1340 = 0;
                    local_1330 = 0;
                    local_1328 = 0;
                    local_1318 = 0;
                    local_1314 = 0;
                    local_1310 = 0;
                    local_130c = 0;
                    local_1308 = 0;
                    local_1300 = 0;
                    local_1338 = 0;
                    local_da0 = &local_12f8;
                    if (local_12f0 != (int *)0x0) {
                      LOCK();
                      iVar1 = *local_12f0;
                      *local_12f0 = *local_12f0 + -1;
                      UNLOCK();
                      if (iVar1 == 1) {
                        if (local_12d8 == (long *)0x0) {
                          if (local_12f8 != (void *)0x0) {
                            free(local_12f8);
                          }
                        }
                        else {
                          (**(code **)(*local_12d8 + 0x18))(local_12d8,local_12f8);
                        }
                      }
                    }
                    local_12f8 = (void *)0x0;
                    local_12e8 = (void *)0x0;
                    local_12e0 = 0;
                    local_12d0 = 0;
                    local_12cc = 0;
                    local_12c8 = 0;
                    local_12c4 = 0;
                    local_12c0 = 0;
                    local_12b8 = (void *)0x0;
                    local_12f0 = (int *)0x0;
                  }
                  local_b38 = &local_13a8;
                  local_b40 = &local_ff0;
                  local_13a8 = (void *)((long)local_ff0 + local_fb0 * local_103c * local_fe0);
                  local_13a0 = (int *)0x0;
                  local_1398 = local_fe0;
                  local_1390 = local_fd8;
                  local_1388 = local_fd0;
                  local_137c = local_fc4;
                  local_1378 = local_fc0;
                  local_1374 = 1;
                  local_1370 = local_fbc;
                  local_1368 = ((long)local_fc4 * (long)local_fc0 * local_fe0 + 0xf &
                               0xfffffffffffffff0) / local_fe0;
                  local_1380 = local_fc8 + -1;
                  if (local_fc8 == 4) {
                    local_1368 = (long)local_fc4 * (long)local_fc0;
                  }
                  local_b44 = local_103c;
                  local_b45 = 1;
                  for (local_13ac = 0; local_13ac < local_eac; local_13ac = local_13ac + 1) {
                    local_a20 = &local_13a8;
                    local_a24 = local_13ac;
                    local_13b8 = (void *)((long)local_13a8 +
                                         (long)local_137c * (long)local_13ac * local_1398);
                    local_13bc = -3.4028235e+38;
                    for (local_13c0 = 0; local_13c0 < local_eb0; local_13c0 = local_13c0 + 1) {
                      pfVar3 = std::max<float>(&local_13bc,
                                               (float *)((long)local_13b8 + (long)local_13c0 * 4));
                      local_13bc = *pfVar3;
                    }
                    local_13c4 = 0.0;
                    for (local_13c8 = 0; local_13c8 < local_eb0; local_13c8 = local_13c8 + 1) {
                      fVar5 = expf(*(float *)((long)local_13b8 + (long)local_13c8 * 4) - local_13bc)
                      ;
                      *(float *)((long)local_13b8 + (long)local_13c8 * 4) = fVar5;
                      local_13c4 = *(float *)((long)local_13b8 + (long)local_13c8 * 4) + local_13c4;
                    }
                    for (local_13cc = 0; local_13cc < local_eb0; local_13cc = local_13cc + 1) {
                      *(float *)((long)local_13b8 + (long)local_13cc * 4) =
                           *(float *)((long)local_13b8 + (long)local_13cc * 4) / local_13c4;
                    }
                  }
                  local_d90 = &local_13a8;
                  if (local_13a0 != (int *)0x0) {
                    LOCK();
                    iVar1 = *local_13a0;
                    *local_13a0 = *local_13a0 + -1;
                    UNLOCK();
                    if (iVar1 == 1) {
                      if (local_1388 == (long *)0x0) {
                        if (local_13a8 != (void *)0x0) {
                          free(local_13a8);
                        }
                      }
                      else {
                        (**(code **)(*local_1388 + 0x18))(local_1388,local_13a8);
                      }
                    }
                  }
                  local_b58 = &local_1418;
                  local_b60 = &local_ff0;
                  local_b78 = &local_1460;
                  local_b80 = &local_fa8;
                  for (local_1464 = 0; local_1464 < local_eac; local_1464 = local_1464 + 1) {
                    local_b98 = &local_14b8;
                    local_ba0 = &local_1038;
                    local_1498 = local_1018;
                    local_ba4 = local_1464;
                    local_ba5 = 1;
                    local_a30 = &local_14b8;
                    local_a34 = local_103c;
                    local_1470 = (long)local_1038 +
                                 (long)local_100c * (long)local_103c * local_1028 +
                                 local_ff8 * local_1464 * local_1028;
                    local_d80 = &local_14b8;
                    local_14b8 = 0;
                    local_14a8 = 0;
                    local_14a0 = 0;
                    local_1490 = 0;
                    local_148c = 0;
                    local_1488 = 0;
                    local_1484 = 0;
                    local_1480 = 0;
                    local_1478 = 0;
                    local_14b0 = 0;
                    for (local_14bc = 0; local_14bc < local_eb4; local_14bc = local_14bc + 1) {
                      local_9b4 = local_1464;
                      local_9b0 = &local_1418;
                      local_9c4 = local_14bc;
                      local_9c0 = &local_1460;
                      local_14d4 = 0.0;
                      local_14d0 = (float *)((long)local_fa8 +
                                            (long)local_f7c * (long)local_14bc * local_f98 +
                                            local_f68 * local_103c * local_f98);
                      local_14c8 = (float *)((long)local_ff0 +
                                            (long)local_fc4 * (long)local_1464 * local_fe0 +
                                            local_fb0 * local_103c * local_fe0);
                      for (local_14d8 = 0; local_14d8 < local_eb0; local_14d8 = local_14d8 + 1) {
                        local_14d4 = *local_14c8 * *local_14d0 + local_14d4;
                        local_14d0 = local_14d0 + 1;
                        local_14c8 = local_14c8 + 1;
                      }
                      *(float *)(local_1470 + (long)local_14bc * 4) = local_14d4;
                    }
                  }
                  local_d70 = &local_1460;
                  local_1370 = 0;
                  local_1374 = 0;
                  local_1378 = 0;
                  local_137c = 0;
                  local_1390 = 0;
                  local_1398 = 0;
                  local_13a0 = (int *)0x0;
                  local_13a8 = (void *)0x0;
                  local_13f8 = local_fd0;
                  local_1440 = local_f88;
                  local_b64 = local_103c;
                  local_b65 = 1;
                  local_b84 = local_103c;
                  local_b85 = 1;
                  local_1368 = 0;
                  local_1380 = 0;
                  local_1460 = 0;
                  local_1450 = 0;
                  local_1448 = 0;
                  local_1438 = 0;
                  local_1434 = 0;
                  local_1430 = 0;
                  local_142c = 0;
                  local_1428 = 0;
                  local_1420 = 0;
                  local_1458 = 0;
                  local_d60 = &local_1418;
                  local_1418 = 0;
                  local_1408 = 0;
                  local_1400 = 0;
                  local_13f0 = 0;
                  local_13ec = 0;
                  local_13e8 = 0;
                  local_13e4 = 0;
                  local_13e0 = 0;
                  local_13d8 = 0;
                  local_1410 = 0;
                }
                for (local_14dc = 0; local_14dc < local_eac; local_14dc = local_14dc + 1) {
                  local_a40 = local_ec0;
                  local_a44 = local_14dc;
                  local_14e8 = (void *)((long)local_ec0->data +
                                       (long)local_ec0->w * (long)local_14dc * local_ec0->elemsize);
                  for (local_14ec = 0; local_14ec < local_eb8; local_14ec = local_14ec + 1) {
                    local_bb8 = &local_1540;
                    local_bc0 = &local_1038;
                    local_1520 = local_1018;
                    local_bc4 = local_14dc;
                    local_bc5 = 1;
                    local_8c8 = &local_1540;
                    local_d50 = &local_1540;
                    local_1540 = 0;
                    local_1530 = 0;
                    local_1528 = 0;
                    local_1518 = 0;
                    local_1514 = 0;
                    local_1510 = 0;
                    local_150c = 0;
                    local_1508 = 0;
                    local_1500 = 0;
                    local_1538 = 0;
                    local_948 = (long *)(in_RDI + 0x2a0);
                    local_920 = (long *)(in_RDI + 0x2e8);
                    local_928 = (long)local_14ec;
                    local_154c = *(float *)(*local_920 + local_928 * 4);
                    local_1548 = (float *)(*local_948 +
                                          (long)(*(int *)(in_RDI + 0xd0) * local_14ec) * 4);
                    local_14f8 = (float *)((long)local_1038 + local_ff8 * local_14dc * local_1028);
                    for (local_1550 = 0; local_1550 < *(int *)(in_RDI + 0xd0);
                        local_1550 = local_1550 + 1) {
                      local_154c = *local_14f8 * *local_1548 + local_154c;
                      local_1548 = local_1548 + 1;
                      local_14f8 = local_14f8 + 1;
                    }
                    *(float *)((long)local_14e8 + (long)local_14ec * 4) = local_154c;
                  }
                }
                local_e1c = 0;
              }
              local_ed0 = 1;
              local_d40 = &local_1038;
              if (local_1030 != (int *)0x0) {
                LOCK();
                iVar1 = *local_1030;
                *local_1030 = *local_1030 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (local_1018 == (long *)0x0) {
                    if (local_1038 != (void *)0x0) {
                      free(local_1038);
                    }
                  }
                  else {
                    (**(code **)(*local_1018 + 0x18))(local_1018,local_1038);
                  }
                }
              }
              local_1038 = (void *)0x0;
              local_1028 = 0;
              local_1020 = 0;
              local_1010 = 0;
              local_100c = 0;
              local_1008 = 0;
              local_1004 = 0;
              local_1000 = 0;
              local_ff8 = 0;
              local_1030 = (int *)0x0;
            }
            local_d30 = &local_ff0;
            if (local_fe8 != (int *)0x0) {
              LOCK();
              iVar1 = *local_fe8;
              *local_fe8 = *local_fe8 + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_fd0 == (long *)0x0) {
                  if (local_ff0 != (void *)0x0) {
                    free(local_ff0);
                  }
                }
                else {
                  (**(code **)(*local_fd0 + 0x18))(local_fd0,local_ff0);
                }
              }
            }
            local_ff0 = (void *)0x0;
            local_fe0 = 0;
            local_fd8 = 0;
            local_fc8 = 0;
            local_fc4 = 0;
            local_fc0 = 0;
            local_fbc = 0;
            local_fb8 = 0;
            local_fb0 = 0;
            local_fe8 = (int *)0x0;
          }
          local_d20 = &local_fa8;
          if (local_fa0 != (int *)0x0) {
            local_77c = 0xffffffff;
            LOCK();
            local_780 = *local_fa0;
            *local_fa0 = *local_fa0 + -1;
            UNLOCK();
            if (local_780 == 1) {
              if (local_f88 == (long *)0x0) {
                if (local_fa8 != (void *)0x0) {
                  free(local_fa8);
                }
              }
              else {
                (**(code **)(*local_f88 + 0x18))(local_f88,local_fa8);
              }
            }
          }
          local_fa8 = (void *)0x0;
          local_f98 = 0;
          local_f90 = 0;
          local_f80 = 0;
          local_f7c = 0;
          local_f78 = 0;
          local_f74 = 0;
          local_f70 = 0;
          local_f68 = 0;
          local_fa0 = (int *)0x0;
        }
        ppvVar6 = &local_f60;
        local_d10 = ppvVar6;
        local_798 = ppvVar6;
        if (local_f58 != (int *)0x0) {
          local_79c = 0xffffffff;
          LOCK();
          local_7a0 = *local_f58;
          *local_f58 = *local_f58 + -1;
          UNLOCK();
          if (local_7a0 == 1) {
            if (local_f40 == (long *)0x0) {
              if (local_f60 != (void *)0x0) {
                free(local_f60);
              }
            }
            else {
              (**(code **)(*local_f40 + 0x18))(local_f40,local_f60);
            }
          }
        }
        *ppvVar6 = (void *)0x0;
        ppvVar6[2] = (void *)0x0;
        *(undefined4 *)(ppvVar6 + 3) = 0;
        *(undefined4 *)(ppvVar6 + 5) = 0;
        *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
        *(undefined4 *)(ppvVar6 + 6) = 0;
        *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
        *(undefined4 *)(ppvVar6 + 7) = 0;
        ppvVar6[8] = (void *)0x0;
        ppvVar6[1] = (void *)0x0;
      }
      ppvVar6 = &local_f18;
      local_d00 = ppvVar6;
      local_7b8 = ppvVar6;
      if (local_f10 != (int *)0x0) {
        local_7bc = 0xffffffff;
        LOCK();
        local_7c0 = *local_f10;
        *local_f10 = *local_f10 + -1;
        UNLOCK();
        if (local_7c0 == 1) {
          if (local_ef8 == (long *)0x0) {
            if (local_f18 != (void *)0x0) {
              free(local_f18);
            }
          }
          else {
            (**(code **)(*local_ef8 + 0x18))(local_ef8,local_f18);
          }
        }
      }
      *ppvVar6 = (void *)0x0;
      ppvVar6[2] = (void *)0x0;
      *(undefined4 *)(ppvVar6 + 3) = 0;
      *(undefined4 *)(ppvVar6 + 5) = 0;
      *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
      *(undefined4 *)(ppvVar6 + 6) = 0;
      *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
      *(undefined4 *)(ppvVar6 + 7) = 0;
      ppvVar6[8] = (void *)0x0;
      ppvVar6[1] = (void *)0x0;
    }
    ppvVar6 = &local_ea8;
    if (local_ea0 != (int *)0x0) {
      local_7dc = 0xffffffff;
      LOCK();
      local_7e0 = *local_ea0;
      *local_ea0 = *local_ea0 + -1;
      UNLOCK();
      if (local_7e0 == 1) {
        local_cf0 = ppvVar6;
        local_7d8 = ppvVar6;
        if (local_e88 == (Allocator *)0x0) {
          if (local_ea8 != (void *)0x0) {
            free(local_ea8);
          }
        }
        else {
          (*local_e88->_vptr_Allocator[3])(local_e88,local_ea8);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    ppvVar6[2] = (void *)0x0;
    *(undefined4 *)(ppvVar6 + 3) = 0;
    *(undefined4 *)(ppvVar6 + 5) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
    *(undefined4 *)(ppvVar6 + 6) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
    *(undefined4 *)(ppvVar6 + 7) = 0;
    ppvVar6[8] = (void *)0x0;
    ppvVar6[1] = (void *)0x0;
  }
  else {
    local_e1c = forward_int8((MultiHeadAttention *)
                             CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                             in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                             in_stack_fffffffffffff888);
  }
  return local_e1c;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;
    const int qdim = weight_data_size / embed_dim;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(qdim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xq.empty())
        return -100;
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xk.empty())
        return -100;
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);
    if (xv.empty())
        return -100;

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xqk.empty())
        return -100;

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);
    if (xqkv.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * scale
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + qdim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < qdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * scale;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < dst_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < qdim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}